

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateMembers
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  long lVar1;
  char *text;
  FieldDescriptor *field;
  
  variables = &(this->super_ImmutableStringFieldGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  field = (this->super_ImmutableStringFieldGenerator).descriptor_;
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,field);
    io::Printer::Print(printer,variables,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
    field = (this->super_ImmutableStringFieldGenerator).descriptor_;
  }
  WriteFieldDocComment(printer,field);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.lang.String get$capitalized_name$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof java.lang.String) {\n    return (java.lang.String) ref;\n  } else {\n    com.google.protobuf.ByteString bs = \n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n"
                    );
  lVar1 = *(long *)((this->super_ImmutableStringFieldGenerator).descriptor_ + 0x30);
  if (*(int *)(lVar1 + 0x8c) == 3) {
    text = "    if ($has_oneof_case_message$) {\n      $oneof_name$_ = s;\n    }\n";
  }
  else {
    text = 
    "    if (bs.isValidUtf8() && ($has_oneof_case_message$)) {\n      $oneof_name$_ = s;\n    }\n";
    if (*(char *)(*(long *)(lVar1 + 0xa0) + 0xa2) != '\0') {
      text = "    if ($has_oneof_case_message$) {\n      $oneof_name$_ = s;\n    }\n";
    }
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,"    return s;\n  }\n}\n");
  WriteFieldDocComment(printer,(this->super_ImmutableStringFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public com.google.protobuf.ByteString\n    get$capitalized_name$Bytes() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof java.lang.String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    if ($has_oneof_case_message$) {\n      $oneof_name$_ = b;\n    }\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::
GenerateMembers(io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);

  if (SupportFieldPresence(descriptor_->file())) {
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case_message$;\n"
    "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.lang.String get$capitalized_name$() {\n"
    "  java.lang.Object ref $default_init$;\n"
    "  if ($has_oneof_case_message$) {\n"
    "    ref = $oneof_name$_;\n"
    "  }\n"
    "  if (ref instanceof java.lang.String) {\n"
    "    return (java.lang.String) ref;\n"
    "  } else {\n"
    "    com.google.protobuf.ByteString bs = \n"
    "        (com.google.protobuf.ByteString) ref;\n"
    "    java.lang.String s = bs.toStringUtf8();\n");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
    "    if ($has_oneof_case_message$) {\n"
    "      $oneof_name$_ = s;\n"
    "    }\n");
  } else {
    printer->Print(variables_,
    "    if (bs.isValidUtf8() && ($has_oneof_case_message$)) {\n"
    "      $oneof_name$_ = s;\n"
    "    }\n");
  }
  printer->Print(variables_,
    "    return s;\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);

  printer->Print(variables_,
    "$deprecation$public com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes() {\n"
    "  java.lang.Object ref $default_init$;\n"
    "  if ($has_oneof_case_message$) {\n"
    "    ref = $oneof_name$_;\n"
    "  }\n"
    "  if (ref instanceof java.lang.String) {\n"
    "    com.google.protobuf.ByteString b = \n"
    "        com.google.protobuf.ByteString.copyFromUtf8(\n"
    "            (java.lang.String) ref);\n"
    "    if ($has_oneof_case_message$) {\n"
    "      $oneof_name$_ = b;\n"
    "    }\n"
    "    return b;\n"
    "  } else {\n"
    "    return (com.google.protobuf.ByteString) ref;\n"
    "  }\n"
    "}\n");
}